

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64_out_32.h
# Opt level: O3

uint32_t __thiscall
PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
          (PMP_Multilinear_Hasher_64_out_32 *this,uchar *chars,uint cnt)

{
  ULARGE_INTEGER__XX *coeff;
  uint32_t *puVar1;
  ULARGE_INTEGER__XX constTerm;
  random_data_for_MPSHF *prVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ushort *tail;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  undefined1 (*pauVar20) [32];
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar48 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_ZMM24 [64];
  uint64_t ctr;
  uint64_t allValues [8];
  undefined1 local_c0 [8];
  long local_b8;
  ulong auStack_68 [9];
  undefined1 auVar47 [32];
  
  uVar14 = 0;
  if (0x1ff < cnt) {
    prVar2 = this->curr_rd;
    uVar14 = cnt >> 9;
    uVar12 = 0;
    uVar21 = prVar2->const_term;
    do {
      auVar49 = ZEXT1664((undefined1  [16])0x0);
      auVar26 = vpxord_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
      in_ZMM24 = ZEXT1664(auVar26);
      lVar22 = 0;
      bVar3 = true;
      do {
        bVar15 = bVar3;
        auVar27 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x1c));
        auVar28 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0x70));
        auVar29 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0x80));
        auVar30 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0xa0));
        auVar31 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0xb0));
        auVar57 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200),
                               *(undefined1 (*) [16])(prVar2->random_coeff + lVar22));
        auVar59 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22),0xf5);
        auVar9 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200),0xf5);
        auVar26 = vpaddq_avx(auVar57,auVar49._0_16_);
        auVar57 = vpsrlq_avx(auVar57,0x20);
        auVar9 = vpmuludq_avx(auVar9,auVar59);
        auVar32 = vpaddq_avx512vl(auVar57,in_ZMM24._0_16_);
        auVar56 = vpsrlq_avx(auVar9,0x20);
        auVar4 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x10),
                              *(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 4));
        auVar57 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 4),0xf5);
        auVar59 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x10),
                              0xf5);
        auVar58 = vpsrlq_avx(auVar4,0x20);
        auVar5 = vpmuludq_avx(auVar59,auVar57);
        auVar6 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x20),
                              *(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 8));
        auVar57 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 8),0xf5);
        auVar59 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x20),
                              0xf5);
        auVar7 = vpmuludq_avx(auVar59,auVar57);
        auVar8 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x30),
                              *(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0xc));
        auVar57 = vpaddq_avx(auVar32,auVar58);
        auVar59 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0xc),0xf5);
        auVar32 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x30),
                              0xf5);
        auVar32 = vpmuludq_avx(auVar32,auVar59);
        auVar59 = vpsrlq_avx(auVar6,0x20);
        auVar58 = vpsrlq_avx(auVar5,0x20);
        auVar59 = vpaddq_avx(auVar56,auVar59);
        auVar56 = vpsrlq_avx(auVar8,0x20);
        auVar57 = vpaddq_avx(auVar57,auVar59);
        auVar59 = vpaddq_avx(auVar58,auVar56);
        auVar56 = vpsrlq_avx(auVar7,0x20);
        auVar59 = vpaddq_avx(auVar59,auVar56);
        auVar57 = vpaddq_avx(auVar57,auVar59);
        auVar59 = vpsrlq_avx(auVar32,0x20);
        auVar56 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x40),
                               *(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x10));
        auVar58 = vpsrlq_avx(auVar56,0x20);
        auVar59 = vpaddq_avx(auVar58,auVar59);
        auVar58 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x10),0xf5);
        auVar10 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x40),
                              0xf5);
        auVar58 = vpmuludq_avx(auVar10,auVar58);
        auVar10 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x50),
                               *(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x14));
        auVar33 = vpsrlq_avx512vl(auVar10,0x20);
        auVar60 = vpsrlq_avx(auVar58,0x20);
        auVar59 = vpaddq_avx512vl(auVar59,auVar33);
        auVar59 = vpaddq_avx(auVar59,auVar60);
        auVar34 = vpaddq_avx512vl(auVar57,auVar59);
        auVar57 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x14),0xf5);
        auVar59 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x50),
                              0xf5);
        auVar59 = vpmuludq_avx(auVar59,auVar57);
        auVar60 = vpsrlq_avx(auVar59,0x20);
        auVar33 = vpmuludq_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x60),
                               *(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x18));
        auVar57 = vpsrlq_avx512vl(auVar33,0x20);
        auVar35 = vpaddq_avx512vl(auVar57,auVar60);
        auVar57 = vpshufd_avx(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x18),0xf5);
        auVar60 = vpshufd_avx(*(undefined1 (*) [16])(chars + lVar22 * 4 + uVar12 * 0x200 + 0x60),
                              0xf5);
        auVar60 = vpmuludq_avx(auVar60,auVar57);
        auVar36 = vpmuludq_avx512vl(auVar28,auVar27);
        auVar57 = vpsrlq_avx512vl(auVar36,0x20);
        auVar61 = vpsrlq_avx(auVar60,0x20);
        auVar57 = vpaddq_avx512vl(auVar35,auVar57);
        auVar57 = vpaddq_avx512vl(auVar57,auVar61);
        auVar27 = vpshufd_avx512vl(auVar27,0xf5);
        auVar35 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x20));
        auVar28 = vpshufd_avx512vl(auVar28,0xf5);
        auVar27 = vpmuludq_avx512vl(auVar28,auVar27);
        auVar28 = vpsrlq_avx512vl(auVar27,0x20);
        auVar61 = vpmuludq_avx512vl(auVar29,auVar35);
        auVar37 = vpsrlq_avx512vl(auVar61,0x20);
        auVar57 = vpaddq_avx512vl(auVar57,auVar37);
        auVar37 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0x90));
        auVar57 = vpaddq_avx512vl(auVar34,auVar57);
        auVar34 = vpshufd_avx512vl(auVar35,0xf5);
        auVar29 = vpshufd_avx512vl(auVar29,0xf5);
        auVar35 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x24));
        auVar29 = vpmuludq_avx512vl(auVar29,auVar34);
        auVar34 = vpsrlq_avx512vl(auVar29,0x20);
        auVar38 = vpmuludq_avx512vl(auVar37,auVar35);
        auVar39 = vpsrlq_avx512vl(auVar38,0x20);
        auVar28 = vpaddq_avx512vl(auVar28,auVar39);
        auVar28 = vpaddq_avx512vl(auVar28,auVar34);
        auVar34 = vpshufd_avx512vl(auVar37,0xf5);
        auVar37 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x28));
        auVar35 = vpshufd_avx512vl(auVar35,0xf5);
        auVar34 = vpmuludq_avx512vl(auVar34,auVar35);
        auVar35 = vpsrlq_avx512vl(auVar34,0x20);
        auVar39 = vpmuludq_avx512vl(auVar30,auVar37);
        auVar40 = vpsrlq_avx512vl(auVar39,0x20);
        auVar28 = vpaddq_avx512vl(auVar28,auVar40);
        auVar40 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x2c));
        auVar28 = vpaddq_avx512vl(auVar28,auVar35);
        auVar35 = vpshufd_avx512vl(auVar37,0xf5);
        auVar30 = vpshufd_avx512vl(auVar30,0xf5);
        auVar30 = vpmuludq_avx512vl(auVar30,auVar35);
        auVar35 = vpsrlq_avx512vl(auVar30,0x20);
        auVar37 = vpmuludq_avx512vl(auVar31,auVar40);
        auVar41 = vpsrlq_avx512vl(auVar37,0x20);
        auVar28 = vpaddq_avx512vl(auVar28,auVar41);
        auVar41 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0xc0));
        auVar57 = vpaddq_avx512vl(auVar57,auVar28);
        auVar28 = vpshufd_avx512vl(auVar40,0xf5);
        auVar31 = vpshufd_avx512vl(auVar31,0xf5);
        auVar40 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x30));
        auVar28 = vpmuludq_avx512vl(auVar31,auVar28);
        auVar31 = vpsrlq_avx512vl(auVar28,0x20);
        auVar42 = vpmuludq_avx512vl(auVar41,auVar40);
        auVar43 = vpsrlq_avx512vl(auVar42,0x20);
        auVar35 = vpaddq_avx512vl(auVar35,auVar43);
        auVar31 = vpaddq_avx512vl(auVar35,auVar31);
        auVar35 = vpshufd_avx512vl(auVar40,0xf5);
        auVar40 = vpshufd_avx512vl(auVar41,0xf5);
        auVar41 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0xd0));
        auVar35 = vpmuludq_avx512vl(auVar40,auVar35);
        auVar40 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x34));
        auVar43 = vpmuludq_avx512vl(auVar41,auVar40);
        auVar40 = vpshufd_avx512vl(auVar40,0xf5);
        auVar41 = vpshufd_avx512vl(auVar41,0xf5);
        auVar40 = vpmuludq_avx512vl(auVar41,auVar40);
        auVar41 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x38));
        auVar44 = vpsrlq_avx512vl(auVar43,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar44);
        auVar44 = vpsrlq_avx512vl(auVar35,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar44);
        auVar44 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0xe0));
        auVar45 = vpmuludq_avx512vl(auVar44,auVar41);
        auVar53 = vpsrlq_avx(auVar45,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar53);
        auVar53 = vpsrlq_avx512vl(auVar40,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar53);
        auVar44 = vpshufd_avx512vl(auVar44,0xf5);
        auVar53 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                      (chars + lVar22 * 4 + uVar12 * 0x200 + 0xf0));
        auVar57 = vpaddq_avx512vl(auVar57,auVar31);
        auVar31 = vpshufd_avx512vl(auVar41,0xf5);
        auVar41 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar2->random_coeff + lVar22 + 0x3c));
        lVar22 = 0x40;
        auVar31 = vpmuludq_avx512vl(auVar44,auVar31);
        auVar44 = vpsrlq_avx512vl(auVar31,0x20);
        auVar46 = vpmuludq_avx512vl(auVar53,auVar41);
        auVar54 = vpsrlq_avx(auVar46,0x20);
        auVar31 = vpaddq_avx512vl(auVar46,auVar31);
        auVar44 = vpaddq_avx512vl(auVar54,auVar44);
        auVar41 = vpshufd_avx512vl(auVar41,0xf5);
        auVar53 = vpshufd_avx512vl(auVar53,0xf5);
        auVar41 = vpmuludq_avx512vl(auVar53,auVar41);
        auVar53 = vpsrlq_avx512vl(auVar41,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar41);
        auVar41 = vpaddq_avx512vl(auVar44,auVar53);
        auVar41 = vpaddq_avx512vl(auVar57,auVar41);
        in_ZMM24 = ZEXT1664(auVar41);
        auVar57 = vpaddq_avx(auVar6,auVar9);
        auVar26 = vpaddq_avx(auVar4,auVar26);
        auVar26 = vpaddq_avx(auVar26,auVar57);
        auVar57 = vpaddq_avx(auVar8,auVar5);
        auVar57 = vpaddq_avx(auVar57,auVar7);
        auVar26 = vpaddq_avx(auVar26,auVar57);
        auVar57 = vpaddq_avx(auVar56,auVar32);
        auVar57 = vpaddq_avx(auVar10,auVar57);
        auVar57 = vpaddq_avx(auVar58,auVar57);
        auVar26 = vpaddq_avx(auVar26,auVar57);
        auVar57 = vpaddq_avx(auVar33,auVar59);
        auVar57 = vpaddq_avx(auVar36,auVar57);
        auVar57 = vpaddq_avx(auVar60,auVar57);
        auVar57 = vpaddq_avx512vl(auVar57,auVar61);
        auVar26 = vpaddq_avx(auVar26,auVar57);
        auVar57 = vpaddq_avx512vl(auVar27,auVar38);
        auVar57 = vpaddq_avx512vl(auVar57,auVar29);
        auVar57 = vpaddq_avx512vl(auVar57,auVar39);
        auVar57 = vpaddq_avx512vl(auVar57,auVar34);
        auVar57 = vpaddq_avx512vl(auVar57,auVar37);
        auVar26 = vpaddq_avx(auVar26,auVar57);
        auVar57 = vpaddq_avx512vl(auVar30,auVar42);
        auVar57 = vpaddq_avx512vl(auVar57,auVar28);
        auVar57 = vpaddq_avx512vl(auVar57,auVar43);
        auVar57 = vpaddq_avx512vl(auVar57,auVar35);
        auVar57 = vpaddq_avx(auVar57,auVar45);
        auVar57 = vpaddq_avx512vl(auVar57,auVar40);
        auVar26 = vpaddq_avx(auVar26,auVar57);
        auVar26 = vpaddq_avx(auVar26,auVar31);
        auVar49 = ZEXT1664(auVar26);
        bVar3 = false;
      } while (bVar15);
      auVar57 = vpunpckhqdq_avx512vl(auVar26,auVar41);
      auVar26 = vpunpcklqdq_avx512vl(auVar26,auVar41);
      auVar26 = vpaddq_avx(auVar26,auVar57);
      lVar19 = vpextrq_avx(auVar26,1);
      lVar19 = (ulong)(uint)(auVar26._4_4_ - (int)lVar19) + lVar19;
      uVar24 = lVar19 << 0x20 | auVar26._0_8_ & 0xffffffff;
      uVar25 = uVar24 + uVar21;
      lVar22 = (uVar25 >> 0x20) * 0xf;
      uVar11 = ((int)((ulong)lVar19 >> 0x20) + (uint)CARRY8(uVar24,uVar21)) * 0xe1 +
               (int)((ulong)lVar22 >> 0x20) * 0xf + 0xf;
      uVar23 = (uint)uVar25;
      uVar16 = uVar11 + uVar23;
      uVar18 = (uint)lVar22;
      uVar17 = uVar16 - uVar18;
      iVar13 = (CARRY4(uVar11,uVar23) + 1) - (uint)(uVar16 < uVar18);
      if (uVar17 < 0x1e) {
        if (iVar13 != 0) {
          uVar17 = (uVar17 - 0xf) + iVar13 * -0xf;
        }
      }
      else {
        uVar17 = uVar17 + iVar13 * -0xf;
      }
      auStack_68[uVar12] = (ulong)uVar17;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  tail = (ushort *)(chars + (cnt & 0xfffffe00));
  constTerm = *(ULARGE_INTEGER__XX *)this->curr_rd;
  coeff = (ULARGE_INTEGER__XX *)this->curr_rd + 2;
  switch(cnt & 0x1ff) {
  case 0:
    uVar21 = 1;
    break;
  case 1:
    uVar21 = (ulong)((byte)*tail | 0x100);
    break;
  case 2:
    uVar21 = (ulong)(*tail | 0x10000);
    break;
  case 3:
    uVar21 = (ulong)((uint)(byte)tail[1] * 0x10000 + 0x1000000 + (uint)*tail);
    break;
  default:
    local_c0 = (undefined1  [8])
               hash_of_beginning_of_string_chunk_type2_noinline
                         (this,(uint32_t *)&coeff->QuadPart,constTerm,(uchar *)tail,cnt & 0x1ff);
    goto LAB_00183263;
  }
  uVar21 = uVar21 * (coeff->field_0).LowPart;
  lVar22 = (constTerm.QuadPart + uVar21 >> 0x20) * 0xf;
  local_b8._0_4_ = (uint)CARRY8(constTerm.QuadPart,uVar21);
  uVar11 = (uint)local_b8 * 0xe1 + 0xf + (int)((ulong)lVar22 >> 0x20) * 0xf;
  local_c0._0_4_ = (undefined4)(constTerm.QuadPart + uVar21);
  uVar18 = uVar11 + local_c0._0_4_;
  uVar17 = (uint)lVar22;
  uVar16 = uVar18 - uVar17;
  iVar13 = (CARRY4(uVar11,local_c0._0_4_) + 1) - (uint)(uVar18 < uVar17);
  local_c0 = SUB98(CONCAT54(CONCAT14(CARRY8(constTerm.QuadPart,uVar21),iVar13),uVar16),0);
  if (uVar16 < 0x1e) {
    if (iVar13 != 0) {
      local_c0._0_4_ = (uVar16 - 0xf) + iVar13 * -0xf;
      goto LAB_00183252;
    }
  }
  else {
    local_c0._0_4_ = iVar13 * -0xf + uVar16;
LAB_00183252:
    local_c0._4_4_ = 0;
  }
LAB_00183263:
  auStack_68[uVar14] = (ulong)local_c0;
  prVar2 = this->curr_rd;
  local_b8 = 0;
  local_c0 = (undefined1  [8])prVar2[1].const_term;
  if (uVar14 < 0x3f) {
    uVar21 = 0;
    lVar22 = 0;
    do {
      uVar12 = (ulong)(uint)auStack_68[uVar21] * (ulong)prVar2[1].random_coeff[uVar21];
      local_b8 = local_b8 + (ulong)CARRY8((ulong)local_c0,uVar12);
      local_c0 = (undefined1  [8])((long)local_c0 + uVar12);
      puVar1 = prVar2[1].random_coeff + uVar21;
      uVar21 = uVar21 + 1;
      lVar22 = lVar22 + (ulong)*puVar1;
    } while (uVar14 + 1 != uVar21);
    uVar21 = prVar2[1].cachedSum - lVar22;
  }
  else {
    lVar22 = 0;
    do {
      lVar19 = lVar22;
      uVar21 = (ulong)*(uint *)((long)auStack_68 + lVar19 * 2) *
               (ulong)*(uint *)((long)prVar2[1].random_coeff + lVar19);
      local_b8 = local_b8 + (ulong)CARRY8((ulong)local_c0,uVar21);
      local_c0 = (undefined1  [8])((long)local_c0 + uVar21);
      lVar22 = lVar19 + 4;
    } while ((ulong)uVar14 * 4 + 4 != lVar19 + 4);
    if (uVar14 < 0x7f) {
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pauVar20 = (undefined1 (*) [32])((long)prVar2[1].random_coeff + lVar19 + 4);
      auVar55 = ZEXT1664((undefined1  [16])0x0);
      auVar50 = vpbroadcastq_avx512f();
      uVar21 = 0;
      do {
        auVar51 = vpbroadcastq_avx512f();
        auVar52 = vmovdqa64_avx512f(auVar55);
        uVar21 = uVar21 + 8;
        auVar55 = vporq_avx512f(auVar51,auVar49);
        uVar12 = vpcmpuq_avx512f(auVar55,auVar50,2);
        auVar47 = vmovdqu32_avx512vl(*pauVar20);
        auVar48._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar47._4_4_;
        auVar48._0_4_ = (uint)((byte)uVar12 & 1) * auVar47._0_4_;
        auVar48._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar47._8_4_;
        auVar48._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar47._12_4_;
        auVar48._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar47._16_4_;
        auVar48._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar47._20_4_;
        auVar48._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar47._24_4_;
        auVar48._28_4_ = (uint)(byte)(uVar12 >> 7) * auVar47._28_4_;
        pauVar20 = pauVar20 + 1;
        auVar55 = vpmovzxdq_avx512f(auVar48);
        auVar55 = vpaddq_avx512f(auVar52,auVar55);
      } while ((0x86 - uVar14 & 0xf8) != uVar21);
      auVar49 = vmovdqa64_avx512f(auVar55);
      bVar3 = (bool)((byte)uVar12 & 1);
      auVar50._0_8_ = (ulong)bVar3 * auVar49._0_8_ | (ulong)!bVar3 * auVar52._0_8_;
      bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar50._8_8_ = (ulong)bVar3 * auVar49._8_8_ | (ulong)!bVar3 * auVar52._8_8_;
      bVar3 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar50._16_8_ = (ulong)bVar3 * auVar49._16_8_ | (ulong)!bVar3 * auVar52._16_8_;
      bVar3 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar50._24_8_ = (ulong)bVar3 * auVar49._24_8_ | (ulong)!bVar3 * auVar52._24_8_;
      bVar3 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar50._32_8_ = (ulong)bVar3 * auVar49._32_8_ | (ulong)!bVar3 * auVar52._32_8_;
      bVar3 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar50._40_8_ = (ulong)bVar3 * auVar49._40_8_ | (ulong)!bVar3 * auVar52._40_8_;
      bVar3 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar50._48_8_ = (ulong)bVar3 * auVar49._48_8_ | (ulong)!bVar3 * auVar52._48_8_;
      auVar50._56_8_ =
           (uVar12 >> 7) * auVar49._56_8_ | (ulong)!SUB81(uVar12 >> 7,0) * auVar52._56_8_;
      auVar47 = vextracti64x4_avx512f(auVar50,1);
      auVar49 = vpaddq_avx512f(auVar50,ZEXT3264(auVar47));
      auVar26 = vpaddq_avx(auVar49._0_16_,auVar49._16_16_);
      auVar57 = vpshufd_avx(auVar26,0xee);
      auVar26 = vpaddq_avx(auVar26,auVar57);
      uVar21 = auVar26._0_8_;
    }
    else {
      uVar21 = 0;
    }
  }
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar21;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = prVar2->const_term;
  _local_c0 = auVar26 * auVar57 + _local_c0;
  uVar14 = (uint)local_b8 * 0xe1 + 0xf + (int)((ulong)(uint)local_c0._4_4_ * 0xf >> 0x20) * 0xf;
  uVar17 = uVar14 + local_c0._0_4_;
  uVar11 = (uint)((ulong)(uint)local_c0._4_4_ * 0xf);
  uVar18 = uVar17 - uVar11;
  iVar13 = (CARRY4(uVar14,local_c0._0_4_) + 1) - (uint)(uVar17 < uVar11);
  local_c0._4_4_ = iVar13;
  local_c0._0_4_ = uVar18;
  if (uVar18 < 0x1e) {
    if (iVar13 == 0) goto LAB_00183430;
    local_c0._0_4_ = (uVar18 - 0xf) + iVar13 * -0xf;
  }
  else {
    local_c0._0_4_ = iVar13 * -0xf + uVar18;
  }
  local_c0._4_4_ = 0;
LAB_00183430:
  if ((ulong)local_c0 >> 0x20 == 0) {
    uVar14 = ((uint)((ulong)local_c0 >> 0xd) & 0x7ffff ^ local_c0._0_4_) * -0x54c41ab1;
    local_c0 = (undefined1  [8])(ulong)(uVar14 >> 0x10 ^ uVar14);
  }
  return SUB84(local_c0,0);
}

Assistant:

NOINLINE uint32_t _hash_noRecursionNoInline_forLessThan8Chunks(const unsigned char* chars, unsigned int cnt) const
  {
			uint64_t allValues[ 8 ];
			uint64_t tmp_hash;
			unsigned int i;
			// process full chunks
			for ( i=0; i<(cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2); i++ )
			{
				allValues[ i ] = hash_of_string_chunk_compact( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), ((const uint32_t*)(chars)) + ( i << PMPML_CHUNK_SIZE_LOG2 ) );
			}
			// process remaining incomplete chunk(s)
			// note: if string size is a multiple of chunk size, we create a new chunk (1,0,0,...0),
			// so THIS PROCESSING IS ALWAYS PERFORMED
			unsigned int tailCnt = cnt & ( PMPML_CHUNK_SIZE_BYTES - 1 );
			const unsigned char* tail = chars + ( (cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2) << PMPML_CHUNK_SIZE_BYTES_LOG2 );
			if ( tailCnt < 4 )
				allValues[ i ] = hash_of_beginning_of_string_chunk_size03( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
			else
				allValues[ i ] = hash_of_beginning_of_string_chunk_type2_noinline( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
//			allValues[ i ] = hash_of_beginning_of_string_chunk_type2( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );

			tmp_hash = hash_of_num_chunk_incomplete( curr_rd[ 1 ].random_coeff,
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].cachedSum)),
							allValues,
							i+1);

			if ( ( tmp_hash >> 32 ) == 0 ) //LIKELY
			{
				return fmix32_short( (uint32_t)tmp_hash );
			}
			return (uint32_t)tmp_hash;
  }